

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

int matchmemaddr(easm_expr **iex,easm_expr **niex1,easm_expr **niex2,easm_expr *expr,int flip)

{
  int iVar1;
  bool local_36;
  bool local_35;
  int flip_local;
  easm_expr *expr_local;
  easm_expr **niex2_local;
  easm_expr **niex1_local;
  easm_expr **iex_local;
  
  iVar1 = easm_isimm(expr);
  if (iVar1 == 0) {
    if (expr->type == EASM_EXPR_ADD) {
      iVar1 = matchmemaddr(iex,niex1,niex2,expr->e1,flip);
      local_35 = false;
      if (iVar1 != 0) {
        iVar1 = matchmemaddr(iex,niex1,niex2,expr->e2,flip);
        local_35 = iVar1 != 0;
      }
      iex_local._4_4_ = (uint)local_35;
    }
    else if (expr->type == EASM_EXPR_SUB) {
      iVar1 = matchmemaddr(iex,niex1,niex2,expr->e1,flip);
      local_36 = false;
      if (iVar1 != 0) {
        iVar1 = matchmemaddr(iex,niex1,niex2,expr->e2,(uint)((flip != 0 ^ 0xffU) & 1));
        local_36 = iVar1 != 0;
      }
      iex_local._4_4_ = (uint)local_36;
    }
    else if (expr->type == EASM_EXPR_NEG) {
      iex_local._4_4_ = matchmemaddr(iex,niex1,niex2,expr->e1,(uint)((flip != 0 ^ 0xffU) & 1));
    }
    else if (flip == 0) {
      if ((niex1 == (easm_expr **)0x0) || (*niex1 != (easm_expr *)0x0)) {
        if ((niex2 == (easm_expr **)0x0) || (*niex2 != (easm_expr *)0x0)) {
          return 0;
        }
        *niex2 = expr;
      }
      else {
        *niex1 = expr;
      }
      iex_local._4_4_ = 1;
    }
    else {
      iex_local._4_4_ = 0;
    }
  }
  else {
    iex_local._4_4_ = addexpr(iex,expr,flip);
  }
  return iex_local._4_4_;
}

Assistant:

int matchmemaddr(struct easm_expr **iex, struct easm_expr **niex1, struct easm_expr **niex2, struct easm_expr *expr, int flip) {
	if (easm_isimm(expr))
		return addexpr(iex, expr, flip);
	if (expr->type == EASM_EXPR_ADD)
		return matchmemaddr(iex, niex1, niex2, expr->e1, flip) && matchmemaddr(iex, niex1, niex2, expr->e2, flip);
	if (expr->type == EASM_EXPR_SUB)
		return matchmemaddr(iex, niex1, niex2, expr->e1, flip) && matchmemaddr(iex, niex1, niex2, expr->e2, !flip);
	if (expr->type == EASM_EXPR_NEG)
		return matchmemaddr(iex, niex1, niex2, expr->e1, !flip);
	if (flip)
		return 0;
	if (niex1 && !*niex1)
		*niex1 = expr;
	else if (niex2 && !*niex2)
		*niex2 = expr;
	else
		return 0;
	return 1;
}